

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

void __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
AsioSocket(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this,
          io_context *io_context)

{
  basic_resolver<asio::ip::tcp,_asio::any_io_executor> *in_RSI;
  Socket *in_RDI;
  io_context *in_stack_ffffffffffffffc8;
  constraint_t<is_convertible<io_context_&,_execution_context_&>::value> in_stack_ffffffffffffffe4;
  io_context *in_stack_ffffffffffffffe8;
  
  Socket::Socket(in_RDI);
  in_RDI->_vptr_Socket = (_func_int **)&PTR_write_some_0094e6a8;
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::
  basic_stream_socket<asio::io_context>
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)in_RDI,
             in_stack_ffffffffffffffc8,0);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  return;
}

Assistant:

AsioSocket(asio::io_context& io_context) :
        socket_(io_context), resolver_(io_context)
    {
    }